

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

int det_3d_filter(double *p0,double *p1,double *p2)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  
  dVar6 = p2[2];
  dVar7 = p1[2];
  dVar1 = p2[1];
  uVar4 = (ulong)DAT_0018e020;
  auVar13._0_8_ = (ulong)*p0 & uVar4;
  auVar2 = *(undefined1 (*) [16])(p0 + 1);
  dVar12 = SUB168(auVar2 & _DAT_0018e020,8);
  dVar11 = SUB168(auVar2 & _DAT_0018e020,0);
  if (dVar12 <= dVar11) {
    dVar12 = dVar11;
  }
  auVar13._8_8_ = dVar12;
  auVar3 = *(undefined1 (*) [16])p1;
  dVar11 = SUB168(auVar3 & _DAT_0018e020,8);
  auVar13 = maxpd(auVar3 & _DAT_0018e020,auVar13);
  auVar9._8_8_ = dVar7;
  auVar9._0_8_ = *p2;
  dVar12 = SUB168(auVar9 & _DAT_0018e020,8);
  auVar13 = maxpd(auVar9 & _DAT_0018e020,auVar13);
  if (dVar12 <= dVar11) {
    dVar12 = dVar11;
  }
  dVar11 = (double)((ulong)dVar1 & uVar4);
  if ((double)((ulong)dVar1 & uVar4) <= dVar12) {
    dVar11 = dVar12;
  }
  dVar12 = (double)(uVar4 & (ulong)dVar6);
  if ((double)(uVar4 & (ulong)dVar6) <= dVar11) {
    dVar12 = dVar11;
  }
  dVar8 = auVar13._0_8_;
  dVar10 = auVar13._8_8_;
  dVar11 = dVar10;
  if ((dVar10 < dVar8) || (dVar15 = dVar10, dVar11 = dVar8, dVar10 <= dVar8)) {
    dVar15 = dVar8;
  }
  dVar14 = dVar12;
  if ((dVar11 <= dVar12) && (dVar14 = dVar11, dVar15 < dVar12)) {
    dVar15 = dVar12;
  }
  iVar5 = 0;
  if ((1.9266338798187158e-98 <= dVar14) && (dVar15 <= 1.1198723710889019e+102)) {
    dVar6 = *p2 * (auVar2._0_8_ * dVar7 - auVar3._8_8_ * auVar2._8_8_) +
            (*p0 * (dVar6 * auVar3._8_8_ - dVar1 * dVar7) -
            (auVar2._0_8_ * dVar6 - dVar1 * auVar2._8_8_) * auVar3._0_8_);
    dVar7 = dVar12 * dVar10 * dVar8 * 3.1113355567168077e-15;
    if (dVar7 < dVar6) {
      return 1;
    }
    if (dVar6 < -dVar7) {
      iVar5 = -1;
    }
  }
  return iVar5;
}

Assistant:

inline int det_3d_filter( const double* p0, const double* p1, const double* p2) {
    double Delta;
    Delta = (((p0[0] * ((p1[1] * p2[2]) - (p1[2] * p2[1]))) - (p1[0] * ((p0[1] * p2[2]) - (p0[2] * p2[1])))) + (p2[0] * ((p0[1] * p1[2]) - (p0[2] * p1[1]))));
    int int_tmp_result;
    double eps;
    double max1 = fabs(p0[0]);
    if( (max1 < fabs(p1[0])) )
    {
        max1 = fabs(p1[0]);
    } 
    if( (max1 < fabs(p2[0])) )
    {
        max1 = fabs(p2[0]);
    } 
    double max2 = fabs(p0[1]);
    if( (max2 < fabs(p0[2])) )
    {
        max2 = fabs(p0[2]);
    } 
    if( (max2 < fabs(p1[1])) )
    {
        max2 = fabs(p1[1]);
    } 
    if( (max2 < fabs(p1[2])) )
    {
        max2 = fabs(p1[2]);
    } 
    double max3 = fabs(p1[1]);
    if( (max3 < fabs(p1[2])) )
    {
        max3 = fabs(p1[2]);
    } 
    if( (max3 < fabs(p2[1])) )
    {
        max3 = fabs(p2[1]);
    } 
    if( (max3 < fabs(p2[2])) )
    {
        max3 = fabs(p2[2]);
    } 
    double lower_bound_1;
    double upper_bound_1;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (lower_bound_1 < 1.92663387981871579179e-98) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.11987237108890185662e+102) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (3.11133555671680765034e-15 * ((max2 * max3) * max1));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return int_tmp_result;
}